

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall
ON_TextureMapping::GetTextureCoordinates
          (ON_TextureMapping *this,ON_Mesh *mesh,ON_SimpleArray<ON_3fPoint> *T,ON_Xform *mesh_xform,
          bool bLazy,ON_SimpleArray<int> *Tside)

{
  uint uVar1;
  uint uVar2;
  ON_TextureCoordinates *pOVar3;
  ON_2fPoint *pOVar4;
  double dVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  ON_3fPoint *pOVar9;
  double *m;
  double *m_00;
  ON_Mesh *mesh_00;
  ON_RenderMeshInfo *pRenderMeshInfo;
  ulong uVar10;
  long lVar11;
  ON_Xform *pOVar12;
  CMeshClosestPointMapper *pCVar13;
  ON_Xform *pOVar14;
  int *piVar15;
  byte bVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  ON_3dPoint P;
  ON_3dVector N;
  ON_2fPointArray temp_tcs;
  ON_3dPoint tc;
  ON_Xform matP;
  ON_Xform matN;
  ON_Xform N_xform;
  ON_Xform P_xform;
  CMeshClosestPointMapper meshMapper;
  int *local_b80;
  ON_3fVector *local_b70;
  ON_3dPoint local_b58;
  ON_3dVector local_b40;
  ON_SimpleArray<ON_2fPoint> local_b28;
  ON_3dPoint local_b10;
  ON_Xform local_af8;
  ON_Xform local_a78;
  ON_Xform local_9f8;
  ON_Xform local_978;
  ON_Xform local_8f8;
  CMeshClosestPointMapper local_878;
  
  bVar16 = 0;
  if ((Tside != (ON_SimpleArray<int> *)0x0) && (-1 < Tside->m_capacity)) {
    Tside->m_count = 0;
  }
  uVar1 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  uVar10 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    return false;
  }
  if (bLazy) {
    lVar8 = (long)(mesh->m_TC).m_count;
    if (0 < lVar8) {
      lVar11 = 0;
      do {
        pOVar3 = (mesh->m_TC).m_a;
        if ((uVar1 == *(uint *)((long)&(pOVar3->m_T).m_count + lVar11)) &&
           (bVar6 = HasMatchingTextureCoordinates
                              (this,(ON_MappingTag *)
                                    ((pOVar3->m_tag).m_mapping_id.Data4 + lVar11 + -8),mesh_xform),
           bVar6)) {
          ON_SimpleArray<ON_3fPoint>::operator=
                    (T,(ON_SimpleArray<ON_3fPoint> *)
                       ((long)&(((mesh->m_TC).m_a)->m_T)._vptr_ON_SimpleArray + lVar11));
          return true;
        }
        lVar11 = lVar11 + 0xb8;
      } while (lVar8 * 0xb8 - lVar11 != 0);
    }
    bVar6 = ON_Mesh::HasTextureCoordinates(mesh);
    if ((bVar6) && (bVar6 = HasMatchingTextureCoordinates(this,&mesh->m_Ttag,mesh_xform), bVar6)) {
      if ((uint)T->m_capacity < uVar1) {
        ON_SimpleArray<ON_3fPoint>::SetCapacity(T,uVar10);
      }
      if ((int)uVar1 <= T->m_capacity) {
        T->m_count = uVar1;
      }
      pOVar9 = T->m_a;
      pOVar4 = (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a;
      lVar8 = 0;
      do {
        pOVar9->x = pOVar4[lVar8].x;
        pOVar9->y = pOVar4[lVar8].y;
        pOVar9->z = 0.0;
        pOVar9 = pOVar9 + 1;
        lVar8 = lVar8 + 1;
      } while (uVar1 != (uint)lVar8);
      return true;
    }
  }
  if (this->m_type == srfp_mapping) {
    if ((uint)T->m_capacity < uVar1) {
      ON_SimpleArray<ON_3fPoint>::SetCapacity(T,uVar10);
    }
    uVar2 = T->m_capacity;
    if ((int)uVar1 <= (int)uVar2) {
      T->m_count = uVar1;
    }
    if (0 < (int)uVar2 && T->m_a != (ON_3fPoint *)0x0) {
      memset(T->m_a,0,(ulong)uVar2 * 0xc);
    }
    bVar6 = GetSPTCHelper(mesh,this,&T->m_a->x,3);
    return bVar6;
  }
  ON_3dVector::ON_3dVector(&local_b40,0.0,0.0,0.0);
  pOVar9 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
  bVar6 = ON_Mesh::HasVertexNormals(mesh);
  if (bVar6) {
    local_b70 = (mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
  }
  else {
    local_b70 = (ON_3fVector *)0x0;
  }
  if ((uint)T->m_capacity < uVar1) {
    ON_SimpleArray<ON_3fPoint>::SetCapacity(T,uVar10);
  }
  if ((int)uVar1 <= T->m_capacity) {
    T->m_count = uVar1;
  }
  if (Tside == (ON_SimpleArray<int> *)0x0) {
    local_b80 = (int *)0x0;
  }
  else {
    if ((uint)Tside->m_capacity < uVar1) {
      ON_SimpleArray<int>::SetCapacity(Tside,uVar10);
    }
    if ((int)uVar1 <= Tside->m_capacity) {
      Tside->m_count = uVar1;
    }
    local_b80 = Tside->m_a;
    memset(local_b80,0,uVar10 * 4);
  }
  pOVar12 = &ON_Xform::IdentityTransformation;
  pOVar14 = &local_8f8;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    pOVar14->m_xform[0][0] = pOVar12->m_xform[0][0];
    pOVar12 = (ON_Xform *)((long)pOVar12 + ((ulong)bVar16 * -2 + 1) * 8);
    pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  pOVar12 = &ON_Xform::IdentityTransformation;
  pOVar14 = &local_978;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    pOVar14->m_xform[0][0] = pOVar12->m_xform[0][0];
    pOVar12 = (ON_Xform *)((long)pOVar12 + ((ulong)bVar16 * -2 + 1) * 8);
    pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  if (((mesh_xform != (ON_Xform *)0x0) && (bVar6 = ON_Xform::IsZero(mesh_xform), !bVar6)) &&
     (bVar6 = ON_Xform::IsIdentity(mesh_xform,0.0), !bVar6)) {
    dVar5 = ON_Xform::GetMappingXforms(mesh_xform,&local_8f8,&local_978);
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      m = ON_Xform::operator[](&local_8f8,0);
      m_00 = ON_Xform::operator[](&local_978,0);
      goto LAB_004e1f6b;
    }
  }
  m = (double *)0x0;
  m_00 = (double *)0x0;
LAB_004e1f6b:
  if (((this->m_projection == clspt_projection) &&
      ((this->m_type == brep_mapping_primitive || (this->m_type == mesh_mapping_primitive)))) &&
     ((this->m_mapping_primitive).super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0)) {
    ON_2fPointArray::ON_2fPointArray((ON_2fPointArray *)&local_b28);
    pOVar12 = &this->m_Pxyz;
    pOVar14 = &local_a78;
    for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
      pOVar14->m_xform[0][0] = pOVar12->m_xform[0][0];
      pOVar12 = (ON_Xform *)((long)pOVar12 + (ulong)bVar16 * -0x10 + 8);
      pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
    }
    pOVar12 = &this->m_Nxyz;
    pOVar14 = &local_9f8;
    for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
      pOVar14->m_xform[0][0] = pOVar12->m_xform[0][0];
      pOVar12 = (ON_Xform *)((long)pOVar12 + (ulong)bVar16 * -0x10 + 8);
      pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
    }
    if (m != (double *)0x0) {
      ON_Xform::ON_Xform(&local_af8,m);
      ON_Xform::operator*((ON_Xform *)&local_878,&local_a78,&local_af8);
      pCVar13 = &local_878;
      pOVar12 = &local_a78;
      for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
        pOVar12->m_xform[0][0] =
             (double)(pCVar13->super_IClosestPointMapper)._vptr_IClosestPointMapper;
        pCVar13 = (CMeshClosestPointMapper *)((long)pCVar13 + ((ulong)bVar16 * -2 + 1) * 8);
        pOVar12 = (ON_Xform *)((long)pOVar12 + ((ulong)bVar16 * -2 + 1) * 8);
      }
    }
    if (m_00 != (double *)0x0) {
      ON_Xform::ON_Xform(&local_af8,m_00);
      ON_Xform::operator*((ON_Xform *)&local_878,&local_9f8,&local_af8);
      pCVar13 = &local_878;
      pOVar12 = &local_9f8;
      for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
        pOVar12->m_xform[0][0] =
             (double)(pCVar13->super_IClosestPointMapper)._vptr_IClosestPointMapper;
        pCVar13 = (CMeshClosestPointMapper *)((long)pCVar13 + ((ulong)bVar16 * -2 + 1) * 8);
        pOVar12 = (ON_Xform *)((long)pOVar12 + ((ulong)bVar16 * -2 + 1) * 8);
      }
    }
    if ((this->m_type == mesh_mapping_primitive) &&
       (mesh_00 = ON_Mesh::Cast((this->m_mapping_primitive).
                                super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr), mesh_00 != (ON_Mesh *)0x0)) {
      pRenderMeshInfo = ON_Mesh::GetRenderMeshInfo(mesh);
      CMeshClosestPointMapper::CMeshClosestPointMapper
                (&local_878,mesh_00,&mesh_00->m_T,pRenderMeshInfo,&local_a78);
      bVar6 = ProjectTextureCoordinates
                        (&local_878.super_IClosestPointMapper,mesh,(ON_2fPointArray *)&local_b28,
                         (double *)&local_a78,(double *)&local_9f8);
      CMeshClosestPointMapper::~CMeshClosestPointMapper(&local_878);
      if (bVar6) {
        if (0 < local_b28.m_count) {
          lVar8 = 0;
          lVar11 = 0;
          do {
            ON_3dPoint::ON_3dPoint
                      ((ON_3dPoint *)&local_878,(double)local_b28.m_a[lVar11].x,
                       (double)local_b28.m_a[lVar11].y,0.0);
            ON_Xform::operator*((ON_3dPoint *)&local_af8,&this->m_uvw,(ON_3dPoint *)&local_878);
            local_878.m_tc = (ON_2fPointArray *)local_af8.m_xform[0][2];
            local_878.super_IClosestPointMapper._vptr_IClosestPointMapper =
                 (_func_int **)local_af8.m_xform[0][0];
            local_878.m_mesh = (ON_Mesh *)local_af8.m_xform[0][1];
            ON_3fPoint::Set((ON_3fPoint *)((long)&T->m_a->x + lVar8),(float)local_af8.m_xform[0][0],
                            (float)local_af8.m_xform[0][1],(float)local_af8.m_xform[0][2]);
            lVar11 = lVar11 + 1;
            lVar8 = lVar8 + 0xc;
          } while (lVar11 < local_b28.m_count);
        }
        if (local_b80 != (int *)0x0) {
          memset(local_b80,0,uVar10 * 4);
        }
      }
    }
    ON_SimpleArray<ON_2fPoint>::~ON_SimpleArray(&local_b28);
  }
  else if ((local_b70 == (ON_3fVector *)0x0) ||
          ((this->m_projection != ray_projection &&
           ((wcsbox_projection < this->m_type || ((0x1068U >> (this->m_type & 0x1f) & 1) == 0))))))
  {
    if (m == (double *)0x0) {
      uVar10 = 1;
      if (1 < (int)uVar1) {
        uVar10 = (ulong)uVar1;
      }
      lVar8 = 0;
      piVar15 = local_b80;
      do {
        ON_3dPoint::operator=(&local_b58,(ON_3fPoint *)((long)&pOVar9->x + lVar8));
        iVar7 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x18])
                          (this,&local_b58,&local_b40,&local_b10);
        ON_3fPoint::operator=((ON_3fPoint *)((long)&T->m_a->x + lVar8),&local_b10);
        if (local_b80 != (int *)0x0) {
          *piVar15 = iVar7;
        }
        piVar15 = piVar15 + 1;
        lVar8 = lVar8 + 0xc;
      } while (uVar10 * 0xc != lVar8);
    }
    else {
      uVar10 = 1;
      if (1 < (int)uVar1) {
        uVar10 = (ulong)uVar1;
      }
      lVar8 = 0;
      piVar15 = local_b80;
      do {
        dVar5 = (double)*(float *)((long)&pOVar9->x + lVar8);
        dVar18 = (double)*(float *)((long)&pOVar9->y + lVar8);
        dVar19 = (double)*(float *)((long)&pOVar9->z + lVar8);
        dVar20 = m[0xe] * dVar19 + m[0xc] * dVar5 + m[0xd] * dVar18 + m[0xf];
        uVar17 = -(ulong)(dVar20 != 0.0);
        local_b58.z = (double)(~uVar17 & 0x3ff0000000000000 | (ulong)(1.0 / dVar20) & uVar17);
        local_b58.x = (m[2] * dVar19 + *m * dVar5 + m[1] * dVar18 + m[3]) * local_b58.z;
        local_b58.y = (m[6] * dVar19 + m[4] * dVar5 + m[5] * dVar18 + m[7]) * local_b58.z;
        local_b58.z = (dVar19 * m[10] + dVar5 * m[8] + dVar18 * m[9] + m[0xb]) * local_b58.z;
        iVar7 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x18])
                          (this,&local_b58,&local_b40,&local_b10);
        ON_3fPoint::operator=((ON_3fPoint *)((long)&T->m_a->x + lVar8),&local_b10);
        if (local_b80 != (int *)0x0) {
          *piVar15 = iVar7;
        }
        piVar15 = piVar15 + 1;
        lVar8 = lVar8 + 0xc;
      } while (uVar10 * 0xc != lVar8);
    }
  }
  else if (m == (double *)0x0 || m_00 == (double *)0x0) {
    uVar10 = 1;
    if (1 < (int)uVar1) {
      uVar10 = (ulong)uVar1;
    }
    lVar8 = 0;
    piVar15 = local_b80;
    do {
      ON_3dPoint::operator=(&local_b58,(ON_3fPoint *)((long)&pOVar9->x + lVar8));
      ON_3dVector::operator=(&local_b40,(ON_3fVector *)((long)&local_b70->x + lVar8));
      iVar7 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x18])
                        (this,&local_b58,&local_b40,&local_b10);
      ON_3fPoint::operator=((ON_3fPoint *)((long)&T->m_a->x + lVar8),&local_b10);
      if (local_b80 != (int *)0x0) {
        *piVar15 = iVar7;
      }
      piVar15 = piVar15 + 1;
      lVar8 = lVar8 + 0xc;
    } while (uVar10 * 0xc != lVar8);
  }
  else {
    uVar10 = 1;
    if (1 < (int)uVar1) {
      uVar10 = (ulong)uVar1;
    }
    lVar8 = 0;
    piVar15 = local_b80;
    do {
      dVar5 = (double)*(float *)((long)&pOVar9->x + lVar8);
      dVar19 = (double)*(float *)((long)&pOVar9->y + lVar8);
      dVar18 = (double)*(float *)((long)&pOVar9->z + lVar8);
      dVar20 = m[0xe] * dVar18 + m[0xc] * dVar5 + m[0xd] * dVar19 + m[0xf];
      uVar17 = -(ulong)(dVar20 != 0.0);
      local_b58.z = (double)(~uVar17 & 0x3ff0000000000000 | (ulong)(1.0 / dVar20) & uVar17);
      local_b58.x = (m[2] * dVar18 + *m * dVar5 + m[1] * dVar19 + m[3]) * local_b58.z;
      local_b58.y = (m[6] * dVar18 + m[4] * dVar5 + m[5] * dVar19 + m[7]) * local_b58.z;
      local_b58.z = (dVar18 * m[10] + dVar5 * m[8] + dVar19 * m[9] + m[0xb]) * local_b58.z;
      dVar5 = (double)*(float *)((long)&local_b70->x + lVar8);
      dVar18 = (double)*(float *)((long)&local_b70->y + lVar8);
      dVar19 = (double)*(float *)((long)&local_b70->z + lVar8);
      local_b40.x = m[2] * dVar19 + *m * dVar5 + m[1] * dVar18;
      local_b40.y = m[6] * dVar19 + m[4] * dVar5 + m[5] * dVar18;
      local_b40.z = m[10] * dVar19 + m[8] * dVar5 + m[9] * dVar18;
      ON_3dVector::Unitize(&local_b40);
      iVar7 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x18])
                        (this,&local_b58,&local_b40,&local_b10);
      ON_3fPoint::operator=((ON_3fPoint *)((long)&T->m_a->x + lVar8),&local_b10);
      if (local_b80 != (int *)0x0) {
        *piVar15 = iVar7;
      }
      piVar15 = piVar15 + 1;
      lVar8 = lVar8 + 0xc;
    } while (uVar10 * 0xc != lVar8);
  }
  return true;
}

Assistant:

bool ON_TextureMapping::GetTextureCoordinates(
          const ON_Mesh& mesh,
          ON_SimpleArray<ON_3fPoint>& T,
          const ON_Xform* mesh_xform,
          bool bLazy,
          ON_SimpleArray<int>* Tside
          ) const
{
  if ( Tside )
    Tside->SetCount(0);

  int i;
  const int vcnt = mesh.m_V.Count();
  if ( vcnt <= 0 )
    return false;

  if ( bLazy )
  {
    int tci, tccount = mesh.m_TC.Count();
    for ( tci = 0; tci < tccount; tci++ )
    {
      if ( vcnt == mesh.m_TC[tci].m_T.Count() )
      {
        if ( HasMatchingTextureCoordinates(mesh.m_TC[tci].m_tag,mesh_xform) )
        {
          T = mesh.m_TC[tci].m_T;
          return true;
        }
      }
    }

    if ( HasMatchingTextureCoordinates(mesh,mesh_xform ) )
    {
      T.Reserve(vcnt);
      T.SetCount(vcnt);
      const ON_2fPoint* f = mesh.m_T.Array();
      ON_3fPoint* d = T.Array();
      for ( i = vcnt; i--; f++, d++ )
      {
        d->x = f->x;
        d->y = f->y;
        d->z = 0.0f;
      }
      return true;
    }
  }

	bool rc = false;

  if ( ON_TextureMapping::TYPE::srfp_mapping == m_type )
  {
    // uv textures from surface parameterization
    T.Reserve(vcnt);
    T.SetCount(vcnt);
    T.Zero();
    rc = GetSPTCHelper(mesh,*this,&T[0].x,3);
	}
  else
  {
    ON_3dPoint  P, tc;
		ON_3dVector N(0.0,0.0,0.0);

		const ON_3fPoint*  mesh_V = mesh.m_V.Array();
		const ON_3fVector* mesh_N = mesh.HasVertexNormals()
                              ? mesh.m_N.Array()
                              : 0;

    T.Reserve(vcnt);
    T.SetCount(vcnt);

    int* Tsd = 0;
    if ( Tside )
    {
      Tside->Reserve(vcnt);
      Tside->SetCount(vcnt);
      Tsd = Tside->Array();
      memset(Tsd,0,vcnt*sizeof(Tsd[0]));
    }

    ON_Xform P_xform(ON_Xform::IdentityTransformation), N_xform(ON_Xform::IdentityTransformation);
    const double* PT = 0;
    const double* NT = 0;
    if ( mesh_xform )
    {
      if ( mesh_xform->IsZero() || mesh_xform->IsIdentity() )
      {
        // ignore transformation
        mesh_xform = 0;
      }
      else if ( 0.0 != mesh_xform->GetMappingXforms(P_xform,N_xform) )
      {
        PT = &P_xform[0][0];
        NT = &N_xform[0][0];
      }
      else
      {
        mesh_xform = 0;
      }
    }

    const float* f;
    double w;
    int sd;

		if (ON_TextureMapping::PROJECTION::clspt_projection == m_projection
      && (ON_TextureMapping::TYPE::mesh_mapping_primitive == m_type || ON_TextureMapping::TYPE::brep_mapping_primitive == m_type)
      && nullptr != m_mapping_primitive)
		{
      rc = false;
			ON_2fPointArray temp_tcs;

			// Jussi, 11-Nov-2010: Apply mapping primitive transformations first

			ON_Xform matP(m_Pxyz);
			ON_Xform matN(m_Nxyz);

			if (nullptr != PT)
				matP = matP * ON_Xform(PT);

			if (nullptr != NT)
				matN = matN * ON_Xform(NT);

			if (ON_TextureMapping::TYPE::mesh_mapping_primitive == m_type)
			{
				const ON_Mesh * pMesh = CustomMappingMeshPrimitive();
				if (nullptr != pMesh)
				{
					CMeshClosestPointMapper meshMapper(*pMesh, pMesh->m_T, mesh.GetRenderMeshInfo(), matP);
					rc = ProjectTextureCoordinates(meshMapper, mesh, temp_tcs, &matP.m_xform[0][0], &matN.m_xform[0][0]);
				}
			}

      if (rc)
			{
				for (int i_local = 0; i_local < temp_tcs.Count(); i_local++)
				{
					// Jussi, 11-Nov-2010: Fix for the problem reported by Michael Fritzsche: Custom mesh mapping does not
					// obey uvw repeat settings. Solution: multiply the 'mapping coordinate' with m_uvw to
					// get the final texture coordinate.

					ON_3dPoint ptT(temp_tcs[i_local].x, temp_tcs[i_local].y, 0.0);
					ptT = m_uvw * ptT;
					T[i_local].Set((float)ptT.x, (float)ptT.y, (float)ptT.z);
				}

				if (nullptr != Tsd)
				{
					memset(Tsd, 0, vcnt * sizeof(int));
				}
			}
		}
		else if ( mesh_N &&
          (   ON_TextureMapping::PROJECTION::ray_projection == m_projection
           || ON_TextureMapping::TYPE::box_mapping == m_type
           || ON_TextureMapping::TYPE::cylinder_mapping == m_type
           || ON_TextureMapping::TYPE::mesh_mapping_primitive == m_type
           || ON_TextureMapping::TYPE::wcsbox_projection == m_type
		   )
        )
  	{
			// calculation uses mesh vertex normal
      if ( PT && NT )
      {
        // need to transform vertex and normal
        // before calculating texture coordinates
			  for (i = 0; i < vcnt; i++)
			  {
          f = &mesh_V[i].x;
				  w = PT[12]*f[0] + PT[13]*f[1] + PT[14]*f[2] + PT[15];
          w = (0.0 != w) ? 1.0/w : 1.0;
				  P.x = w*(PT[0]*f[0] + PT[1]*f[1] + PT[ 2]*f[2] + PT[ 3]);
				  P.y = w*(PT[4]*f[0] + PT[5]*f[1] + PT[ 6]*f[2] + PT[ 7]);
				  P.z = w*(PT[8]*f[0] + PT[9]*f[1] + PT[10]*f[2] + PT[11]);

          f = &mesh_N[i].x;
          N.x = PT[0]*f[0] + PT[1]*f[1] + PT[ 2]*f[2];
				  N.y = PT[4]*f[0] + PT[5]*f[1] + PT[ 6]*f[2];
				  N.z = PT[8]*f[0] + PT[9]*f[1] + PT[10]*f[2];
          N.Unitize();
				  sd = Evaluate(P,N,&tc);
				  T[i] = tc;
          if ( Tsd ) Tsd[i] = sd;
			  }
      }
			else
      {
        // mesh vertex and normal are ok
			  for (i = 0; i < vcnt; i++)
			  {
				  P = mesh_V[i];
				  N = mesh_N[i];
				  sd = Evaluate(P,N,&tc);
				  T[i] = tc;
          if ( Tsd ) Tsd[i] = sd;
			  }
      }
		}
		else if ( PT )
    {
      // normal is not used
      // mesh vertex needs to be transformed
      for ( i = 0; i < vcnt; i++ )
      {
        f = &mesh_V[i].x;
			  w = PT[12]*f[0] + PT[13]*f[1] + PT[14]*f[2] + PT[15];
        w = (0.0 != w) ? 1.0/w : 1.0;
			  P.x = w*(PT[0]*f[0] + PT[1]*f[1] + PT[ 2]*f[2] + PT[ 3]);
			  P.y = w*(PT[4]*f[0] + PT[5]*f[1] + PT[ 6]*f[2] + PT[ 7]);
			  P.z = w*(PT[8]*f[0] + PT[9]*f[1] + PT[10]*f[2] + PT[11]);
        sd = Evaluate(P,N,&tc);
			  T[i] = tc;
        if ( Tsd )
          Tsd[i] = sd;
		  }
    }
    else
		{
			// normal is not used and mesh vertex is ok
			for ( i = 0; i < vcnt; i++ )
			{
				P = mesh_V[i];
				sd = Evaluate(P,N,&tc);
				T[i] = tc;
				if ( Tsd )
					Tsd[i] = sd;
			}
    }
    rc = true;
	}

	return rc;
}